

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

void __thiscall PlayerStrategy::PlayerStrategy(PlayerStrategy *this,PlayerStrategy *toCopy)

{
  int *piVar1;
  string *__return_storage_ptr__;
  PlayerStrategy *toCopy_local;
  PlayerStrategy *this_local;
  
  this->_vptr_PlayerStrategy = (_func_int **)&PTR___cxa_pure_virtual_001688c8;
  piVar1 = (int *)operator_new(4);
  *piVar1 = -1;
  this->numWeakest = piVar1;
  this->exchangingCardType = toCopy->exchangingCardType;
  this->armiesToPlace = toCopy->armiesToPlace;
  this->player = toCopy->player;
  this->from = toCopy->from;
  this->to = toCopy->to;
  __return_storage_ptr__ = (string *)operator_new(0x20);
  getStrategyName_abi_cxx11_(__return_storage_ptr__,toCopy);
  this->strategyName = __return_storage_ptr__;
  return;
}

Assistant:

PlayerStrategy::PlayerStrategy(const PlayerStrategy& toCopy) {
    this->exchangingCardType = toCopy.exchangingCardType;
    this->armiesToPlace = toCopy.armiesToPlace;
    this->player = toCopy.player;
    this->from = toCopy.from;
    this->to = toCopy.to;
    this->strategyName = new std::string(toCopy.getStrategyName());
}